

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_action.cc
# Opt level: O2

void re2c::genYYFill(OutputFile *o,size_t need)

{
  opt_t *poVar1;
  OutputFile *pOVar2;
  size_t local_58;
  string local_50;
  string local_30;
  
  local_58 = need;
  poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  std::__cxx11::string::string((string *)&local_50,(string *)&poVar1->fill);
  poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  replaceParam<unsigned_long>(&local_30,&local_50,&poVar1->fill_arg,&local_58);
  OutputFile::wstring(o,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  if (poVar1->fill_naked == false) {
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if (poVar1->fill_arg_use == true) {
      pOVar2 = OutputFile::ws(o,"(");
      pOVar2 = OutputFile::wu64(pOVar2,local_58);
      OutputFile::ws(pOVar2,")");
    }
    OutputFile::ws(o,";");
  }
  OutputFile::ws(o,"\n");
  return;
}

Assistant:

void genYYFill (OutputFile & o, size_t need)
{
	o.wstring(replaceParam (opts->fill, opts->fill_arg, need));
	if (!opts->fill_naked)
	{
		if (opts->fill_arg_use)
		{
			o.ws("(").wu64(need).ws(")");
		}
		o.ws(";");
	}
	o.ws("\n");
}